

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlBufPtr buf;
  ulong uVar4;
  byte *str;
  int iStack_50;
  xmlChar blank;
  xmlXPathObjectPtr local_38;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      iStack_50 = 0xc;
      goto LAB_001d8b28;
    }
    pxVar1 = ctxt->context;
    pxVar2 = xmlXPathCastNodeToString(pxVar1->node);
    pxVar3 = xmlXPathCacheWrapString(pxVar1,pxVar2);
    valuePush(ctxt,pxVar3);
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_50 = 0x17;
    goto LAB_001d8b28;
  }
  if (ctxt->value == (xmlXPathObjectPtr)0x0) {
LAB_001d8b26:
    iStack_50 = 0xb;
LAB_001d8b28:
    xmlXPathErr(ctxt,iStack_50);
    return;
  }
  if (ctxt->value->type != XPATH_STRING) {
    xmlXPathStringFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
    goto LAB_001d8b26;
  }
  pxVar3 = valuePop(ctxt);
  str = pxVar3->stringval;
  buf = xmlBufCreate();
  if (str == (byte *)0x0 || buf == (xmlBufPtr)0x0) {
LAB_001d8bc4:
    xmlXPathReleaseObject(ctxt->context,pxVar3);
    return;
  }
  while ((uVar4 = (ulong)*str, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    str = str + 1;
  }
  blank = '\0';
  local_38 = pxVar3;
LAB_001d8b4c:
  if ((byte)uVar4 < 0x21) {
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0) goto LAB_001d8b6d;
      pxVar1 = ctxt->context;
      pxVar2 = xmlBufContent(buf);
      pxVar3 = xmlXPathCacheNewString(pxVar1,pxVar2);
      valuePush(ctxt,pxVar3);
      xmlBufFree(buf);
      pxVar3 = local_38;
      goto LAB_001d8bc4;
    }
    blank = ' ';
  }
  else {
LAB_001d8b6d:
    if (blank != '\0') {
      xmlBufAdd(buf,&blank,1);
      blank = '\0';
    }
    xmlBufAdd(buf,str,1);
  }
  uVar4 = (ulong)str[1];
  str = str + 1;
  goto LAB_001d8b4c;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr obj = NULL;
  xmlChar *source = NULL;
  xmlBufPtr target;
  xmlChar blank;

  if (ctxt == NULL) return;
  if (nargs == 0) {
    /* Use current context node */
      valuePush(ctxt,
	  xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
    nargs = 1;
  }

  CHECK_ARITY(1);
  CAST_TO_STRING;
  CHECK_TYPE(XPATH_STRING);
  obj = valuePop(ctxt);
  source = obj->stringval;

  target = xmlBufCreate();
  if (target && source) {

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
      source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
      if (IS_BLANK_CH(*source)) {
	blank = 0x20;
      } else {
	if (blank) {
	  xmlBufAdd(target, &blank, 1);
	  blank = 0;
	}
	xmlBufAdd(target, source, 1);
      }
      source++;
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, obj);
}